

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMultiphysicsCompMesh.cpp
# Opt level: O1

void __thiscall TPZMultiphysicsCompMesh::TPZMultiphysicsCompMesh(TPZMultiphysicsCompMesh *this)

{
  *(undefined ***)&this->super_TPZCompMesh = &PTR__TPZSavable_0194d360;
  TPZCompMesh::TPZCompMesh(&this->super_TPZCompMesh,&PTR_PTR_0194d178);
  *(undefined ***)&this->super_TPZCompMesh = &PTR__TPZMultiphysicsCompMesh_0194d060;
  TPZVec<int>::TPZVec(&(this->m_active_approx_spaces).super_TPZVec<int>,0);
  (this->m_active_approx_spaces).super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0183cde8;
  (this->m_active_approx_spaces).super_TPZVec<int>.fStore = (this->m_active_approx_spaces).fExtAlloc
  ;
  (this->m_active_approx_spaces).super_TPZVec<int>.fNElements = 0;
  (this->m_active_approx_spaces).super_TPZVec<int>.fNAlloc = 0;
  TPZVec<TPZCompMesh_*>::TPZVec(&(this->m_mesh_vector).super_TPZVec<TPZCompMesh_*>,0);
  (this->m_mesh_vector).super_TPZVec<TPZCompMesh_*>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0194d3d0;
  (this->m_mesh_vector).super_TPZVec<TPZCompMesh_*>.fStore = (this->m_mesh_vector).fExtAlloc;
  (this->m_mesh_vector).super_TPZVec<TPZCompMesh_*>.fNElements = 0;
  (this->m_mesh_vector).super_TPZVec<TPZCompMesh_*>.fNAlloc = 0;
  TPZManVector<int,_5>::Resize(&this->m_active_approx_spaces,0);
  TPZManVector<TPZCompMesh_*,_7>::Resize(&this->m_mesh_vector,0);
  return;
}

Assistant:

TPZMultiphysicsCompMesh::TPZMultiphysicsCompMesh() : TPZCompMesh(){
    
    m_active_approx_spaces.Resize(0);
    m_mesh_vector.Resize(0);
}